

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
argstest::Command::GetDescription_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *__return_storage_ptr__,Command *this,HelpParams *params,uint indent)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Options OVar4;
  int iVar5;
  ulong uVar6;
  vector<argstest::Base_*,_std::allocator<argstest::Base_*>_> *this_00;
  reference ppBVar7;
  iterator iVar8;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  __last;
  reference ptVar9;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_basic_string<char>,_unsigned_int>_> *p_Var10;
  string *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  uint local_304;
  uint local_300;
  uint local_2fc;
  undefined1 local_2f8 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  childDescription;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2_1;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_270;
  const_iterator local_268;
  undefined1 local_260 [8];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  groupDescriptions;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<argstest::Base_*,_std::allocator<argstest::Base_*>_> *__range2;
  uint local_220 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *progline;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  ostringstream local_1b8 [7];
  bool empty;
  ostringstream s;
  int local_2c;
  uint addindent;
  HelpParams *pHStack_20;
  uint indent_local;
  HelpParams *params_local;
  Command *this_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *descriptions;
  
  addindent = indent;
  pHStack_20 = params;
  params_local = (HelpParams *)this;
  this_local = (Command *)__return_storage_ptr__;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(__return_storage_ptr__);
  local_2c = 0;
  UpdateSubparserHelp(this,pHStack_20);
  uVar3 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((uVar3 & 1) == 0) {
    if ((pHStack_20->showCommandFullHelp & 1U) == 0) {
      psVar11 = Name_abi_cxx11_(this);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int_const&>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                  *)__return_storage_ptr__,psVar11,&this->help,&addindent);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      bVar2 = true;
      GetCommandProgramLine_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__begin4,this,pHStack_20);
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin4);
      progline = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&progline), bVar1) {
        local_1f8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end4);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          std::operator<<((ostream *)local_1b8,' ');
        }
        std::operator<<((ostream *)local_1b8,(string *)local_1f8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin4);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::__cxx11::string,char_const(&)[1],unsigned_int_const&>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                  *)__return_storage_ptr__,&local_218,(char (*) [1])0x2ba4a8,&addindent);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    if (((pHStack_20->showCommandChildren & 1U) == 0) &&
       ((pHStack_20->showCommandFullHelp & 1U) == 0)) {
      return __return_storage_ptr__;
    }
    local_2c = 1;
  }
  if (((pHStack_20->showCommandFullHelp & 1U) != 0) &&
     (uVar3 = (*(this->super_Group).super_Base._vptr_Base[2])(), (uVar3 & 1) == 0)) {
    local_220[0] = addindent + local_2c;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                *)__return_storage_ptr__,(char (*) [1])0x2ba4a8,(char (*) [1])0x2ba4a8,local_220);
    Description_abi_cxx11_(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_340 = Description_abi_cxx11_(this);
    }
    else {
      local_340 = Help_abi_cxx11_(this);
    }
    __range2._4_4_ = addindent + local_2c;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::__cxx11::string_const&,char_const(&)[1],unsigned_int>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                *)__return_storage_ptr__,local_340,(char (*) [1])0x2ba4a8,
               (uint *)((long)&__range2 + 4));
    __range2._0_4_ = addindent + local_2c;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                *)__return_storage_ptr__,(char (*) [1])0x2ba4a8,(char (*) [1])0x2ba4a8,
               (uint *)&__range2);
  }
  this_00 = Group::Children(&this->super_Group);
  __end2 = std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::begin(this_00);
  child = (Base *)std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
                                     *)&child), bVar2) {
    ppBVar7 = __gnu_cxx::
              __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
              ::operator*(&__end2);
    groupDescriptions.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppBVar7;
    OVar4 = Base::GetOptions((Base *)groupDescriptions.
                                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    OVar4 = operator&(OVar4,HiddenFromDescription);
    if (OVar4 == None) {
      (**(code **)(*(long *)&((groupDescriptions.
                               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             ).
                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  + 0x20))
                (local_260,
                 groupDescriptions.
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pHStack_20,addindent + local_2c)
      ;
      local_270._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)std::
              end<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                        (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>const*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
      ::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*>
                ((__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>const*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                  *)&local_268,&local_270);
      iVar8 = std::
              begin<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                        ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_260);
      __first = std::
                make_move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>
                          ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                            )iVar8._M_current);
      iVar8 = std::
              end<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                        ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_260);
      __last = std::
               make_move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>
                         ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           )iVar8._M_current);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>,void>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                  *)__return_storage_ptr__,local_268,__first,__last);
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)local_260);
    }
    __gnu_cxx::
    __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::begin(&this->subparserDescription);
  childDescription.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._8_8_ =
       std::
       vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(&this->subparserDescription);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                             *)((long)&childDescription.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                       ._M_head_impl.field_2 + 8)), bVar2) {
    ptVar9 = __gnu_cxx::
             __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::operator*(&__end2_1);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)local_2f8,ptVar9);
    iVar5 = addindent + local_2c;
    p_Var10 = std::get<2ul,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                          *)local_2f8);
    *p_Var10 = *p_Var10 + iVar5;
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::push_back(__return_storage_ptr__,
                (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)local_2f8);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_2f8);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
    ::operator++(&__end2_1);
  }
  if (((pHStack_20->showCommandFullHelp & 1U) != 0) &&
     (uVar3 = (*(this->super_Group).super_Base._vptr_Base[2])(), (uVar3 & 1) == 0)) {
    local_2fc = addindent + local_2c;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                *)__return_storage_ptr__,(char (*) [1])0x2ba4a8,(char (*) [1])0x2ba4a8,&local_2fc);
    Epilog_abi_cxx11_(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      psVar11 = Epilog_abi_cxx11_(this);
      local_300 = addindent + local_2c;
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::__cxx11::string_const&,char_const(&)[1],unsigned_int>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                  *)__return_storage_ptr__,psVar11,(char (*) [1])0x2ba4a8,&local_300);
      local_304 = addindent + local_2c;
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                  *)__return_storage_ptr__,(char (*) [1])0x2ba4a8,(char (*) [1])0x2ba4a8,&local_304)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::tuple<std::string, std::string, unsigned>> GetDescription(const HelpParams &params, const unsigned int indent) const override
            {
                std::vector<std::tuple<std::string, std::string, unsigned>> descriptions;
                unsigned addindent = 0;

                UpdateSubparserHelp(params);

                if (!Matched())
                {
                    if (params.showCommandFullHelp)
                    {
                        std::ostringstream s;
                        bool empty = true;
                        for (const auto &progline: GetCommandProgramLine(params))
                        {
                            if (!empty)
                            {
                                s << ' ';
                            }
                            else
                            {
                                empty = false;
                            }

                            s << progline;
                        }

                        descriptions.emplace_back(s.str(), "", indent);
                    }
                    else
                    {
                        descriptions.emplace_back(Name(), help, indent);
                    }

                    if (!params.showCommandChildren && !params.showCommandFullHelp)
                    {
                        return descriptions;
                    }

                    addindent = 1;
                }

                if (params.showCommandFullHelp && !Matched())
                {
                    descriptions.emplace_back("", "", indent + addindent);
                    descriptions.emplace_back(Description().empty() ? Help() : Description(), "", indent + addindent);
                    descriptions.emplace_back("", "", indent + addindent);
                }

                for (Base *child: Children())
                {
                    if ((child->GetOptions() & Options::HiddenFromDescription) != Options::None)
                    {
                        continue;
                    }

                    auto groupDescriptions = child->GetDescription(params, indent + addindent);
                    descriptions.insert(
                                        std::end(descriptions),
                                        std::make_move_iterator(std::begin(groupDescriptions)),
                                        std::make_move_iterator(std::end(groupDescriptions)));
                }

                for (auto childDescription: subparserDescription)
                {
                    std::get<2>(childDescription) += indent + addindent;
                    descriptions.push_back(std::move(childDescription));
                }

                if (params.showCommandFullHelp && !Matched())
                {
                    descriptions.emplace_back("", "", indent + addindent);
                    if (!Epilog().empty())
                    {
                        descriptions.emplace_back(Epilog(), "", indent + addindent);
                        descriptions.emplace_back("", "", indent + addindent);
                    }
                }

                return descriptions;
            }